

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv32_impl.h
# Opt level: O0

void secp256k1_modinv32_normalize_30
               (secp256k1_modinv32_signed30 *r,int32_t sign,secp256k1_modinv32_modinfo *modinfo)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  int iVar20;
  uint *in_RDX;
  int32_t in_ESI;
  secp256k1_modinv32_signed30 *in_RDI;
  int unaff_retaddr;
  secp256k1_modinv32_signed30 *in_stack_00000008;
  int i;
  int32_t cond_negate;
  int32_t cond_add;
  int32_t r8;
  int32_t r7;
  int32_t r6;
  int32_t r5;
  int32_t r4;
  int32_t r3;
  int32_t r2;
  int32_t r1;
  int32_t r0;
  int32_t M30;
  int local_4c;
  
  iVar20 = in_RDI->v[0];
  iVar1 = in_RDI->v[1];
  iVar2 = in_RDI->v[2];
  iVar3 = in_RDI->v[3];
  iVar4 = in_RDI->v[4];
  iVar5 = in_RDI->v[5];
  iVar6 = in_RDI->v[6];
  iVar7 = in_RDI->v[7];
  iVar8 = in_RDI->v[8];
  for (local_4c = 0; local_4c < 9; local_4c = local_4c + 1) {
    if (in_RDI->v[local_4c] < -0x3fffffff) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/mzumsande[P]bitcoin/src/secp256k1/src/modinv32_impl.h"
              ,0x49,"test condition failed: r->v[i] >= -M30");
      abort();
    }
    if (0x3fffffff < in_RDI->v[local_4c]) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/mzumsande[P]bitcoin/src/secp256k1/src/modinv32_impl.h"
              ,0x4a,"test condition failed: r->v[i] <= M30");
      abort();
    }
  }
  iVar9 = secp256k1_modinv32_mul_cmp_30(in_stack_00000008,unaff_retaddr,in_RDI,in_ESI);
  if (iVar9 < 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/mzumsande[P]bitcoin/src/secp256k1/src/modinv32_impl.h"
            ,0x4c,
            "test condition failed: secp256k1_modinv32_mul_cmp_30(r, 9, &modinfo->modulus, -2) > 0")
    ;
    abort();
  }
  iVar9 = secp256k1_modinv32_mul_cmp_30(in_stack_00000008,unaff_retaddr,in_RDI,in_ESI);
  if (iVar9 < 0) {
    uVar10 = iVar8 >> 0x1f;
    uVar11 = in_ESI >> 0x1f;
    uVar12 = ((*in_RDX & uVar10) + iVar20 ^ uVar11) - uVar11;
    uVar13 = ((int)uVar12 >> 0x1e) + (((in_RDX[1] & uVar10) + iVar1 ^ uVar11) - uVar11);
    uVar14 = ((int)uVar13 >> 0x1e) + (((in_RDX[2] & uVar10) + iVar2 ^ uVar11) - uVar11);
    uVar15 = ((int)uVar14 >> 0x1e) + (((in_RDX[3] & uVar10) + iVar3 ^ uVar11) - uVar11);
    uVar16 = ((int)uVar15 >> 0x1e) + (((in_RDX[4] & uVar10) + iVar4 ^ uVar11) - uVar11);
    uVar17 = ((int)uVar16 >> 0x1e) + (((in_RDX[5] & uVar10) + iVar5 ^ uVar11) - uVar11);
    uVar18 = ((int)uVar17 >> 0x1e) + (((in_RDX[6] & uVar10) + iVar6 ^ uVar11) - uVar11);
    uVar19 = ((int)uVar18 >> 0x1e) + (((in_RDX[7] & uVar10) + iVar7 ^ uVar11) - uVar11);
    iVar20 = ((int)uVar19 >> 0x1e) + (((in_RDX[8] & uVar10) + iVar8 ^ uVar11) - uVar11);
    uVar10 = iVar20 >> 0x1f;
    uVar11 = (*in_RDX & uVar10) + (uVar12 & 0x3fffffff);
    uVar12 = ((int)uVar11 >> 0x1e) + (in_RDX[1] & uVar10) + (uVar13 & 0x3fffffff);
    uVar13 = ((int)uVar12 >> 0x1e) + (in_RDX[2] & uVar10) + (uVar14 & 0x3fffffff);
    uVar14 = ((int)uVar13 >> 0x1e) + (in_RDX[3] & uVar10) + (uVar15 & 0x3fffffff);
    uVar15 = ((int)uVar14 >> 0x1e) + (in_RDX[4] & uVar10) + (uVar16 & 0x3fffffff);
    uVar16 = ((int)uVar15 >> 0x1e) + (in_RDX[5] & uVar10) + (uVar17 & 0x3fffffff);
    uVar17 = ((int)uVar16 >> 0x1e) + (in_RDX[6] & uVar10) + (uVar18 & 0x3fffffff);
    uVar18 = ((int)uVar17 >> 0x1e) + (in_RDX[7] & uVar10) + (uVar19 & 0x3fffffff);
    iVar20 = ((int)uVar18 >> 0x1e) + (in_RDX[8] & uVar10) + iVar20;
    in_RDI->v[0] = uVar11 & 0x3fffffff;
    in_RDI->v[1] = uVar12 & 0x3fffffff;
    in_RDI->v[2] = uVar13 & 0x3fffffff;
    in_RDI->v[3] = uVar14 & 0x3fffffff;
    in_RDI->v[4] = uVar15 & 0x3fffffff;
    in_RDI->v[5] = uVar16 & 0x3fffffff;
    in_RDI->v[6] = uVar17 & 0x3fffffff;
    in_RDI->v[7] = uVar18 & 0x3fffffff;
    in_RDI->v[8] = iVar20;
    if (iVar20 >> 0x1e != 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/mzumsande[P]bitcoin/src/secp256k1/src/modinv32_impl.h"
              ,0x9b,"test condition failed: r8 >> 30 == 0");
      abort();
    }
    iVar20 = secp256k1_modinv32_mul_cmp_30(in_stack_00000008,unaff_retaddr,in_RDI,in_ESI);
    if (-1 < iVar20) {
      iVar20 = secp256k1_modinv32_mul_cmp_30(in_stack_00000008,unaff_retaddr,in_RDI,in_ESI);
      if (iVar20 < 0) {
        return;
      }
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/mzumsande[P]bitcoin/src/secp256k1/src/modinv32_impl.h"
              ,0x9d,
              "test condition failed: secp256k1_modinv32_mul_cmp_30(r, 9, &modinfo->modulus, 1) < 0"
             );
      abort();
    }
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/mzumsande[P]bitcoin/src/secp256k1/src/modinv32_impl.h"
            ,0x9c,
            "test condition failed: secp256k1_modinv32_mul_cmp_30(r, 9, &modinfo->modulus, 0) >= 0")
    ;
    abort();
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/mzumsande[P]bitcoin/src/secp256k1/src/modinv32_impl.h"
          ,0x4d,
          "test condition failed: secp256k1_modinv32_mul_cmp_30(r, 9, &modinfo->modulus, 1) < 0");
  abort();
}

Assistant:

static void secp256k1_modinv32_normalize_30(secp256k1_modinv32_signed30 *r, int32_t sign, const secp256k1_modinv32_modinfo *modinfo) {
    const int32_t M30 = (int32_t)(UINT32_MAX >> 2);
    int32_t r0 = r->v[0], r1 = r->v[1], r2 = r->v[2], r3 = r->v[3], r4 = r->v[4],
            r5 = r->v[5], r6 = r->v[6], r7 = r->v[7], r8 = r->v[8];
    volatile int32_t cond_add, cond_negate;

#ifdef VERIFY
    /* Verify that all limbs are in range (-2^30,2^30). */
    int i;
    for (i = 0; i < 9; ++i) {
        VERIFY_CHECK(r->v[i] >= -M30);
        VERIFY_CHECK(r->v[i] <= M30);
    }
    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(r, 9, &modinfo->modulus, -2) > 0); /* r > -2*modulus */
    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(r, 9, &modinfo->modulus, 1) < 0); /* r < modulus */
#endif

    /* In a first step, add the modulus if the input is negative, and then negate if requested.
     * This brings r from range (-2*modulus,modulus) to range (-modulus,modulus). As all input
     * limbs are in range (-2^30,2^30), this cannot overflow an int32_t. Note that the right
     * shifts below are signed sign-extending shifts (see assumptions.h for tests that that is
     * indeed the behavior of the right shift operator). */
    cond_add = r8 >> 31;
    r0 += modinfo->modulus.v[0] & cond_add;
    r1 += modinfo->modulus.v[1] & cond_add;
    r2 += modinfo->modulus.v[2] & cond_add;
    r3 += modinfo->modulus.v[3] & cond_add;
    r4 += modinfo->modulus.v[4] & cond_add;
    r5 += modinfo->modulus.v[5] & cond_add;
    r6 += modinfo->modulus.v[6] & cond_add;
    r7 += modinfo->modulus.v[7] & cond_add;
    r8 += modinfo->modulus.v[8] & cond_add;
    cond_negate = sign >> 31;
    r0 = (r0 ^ cond_negate) - cond_negate;
    r1 = (r1 ^ cond_negate) - cond_negate;
    r2 = (r2 ^ cond_negate) - cond_negate;
    r3 = (r3 ^ cond_negate) - cond_negate;
    r4 = (r4 ^ cond_negate) - cond_negate;
    r5 = (r5 ^ cond_negate) - cond_negate;
    r6 = (r6 ^ cond_negate) - cond_negate;
    r7 = (r7 ^ cond_negate) - cond_negate;
    r8 = (r8 ^ cond_negate) - cond_negate;
    /* Propagate the top bits, to bring limbs back to range (-2^30,2^30). */
    r1 += r0 >> 30; r0 &= M30;
    r2 += r1 >> 30; r1 &= M30;
    r3 += r2 >> 30; r2 &= M30;
    r4 += r3 >> 30; r3 &= M30;
    r5 += r4 >> 30; r4 &= M30;
    r6 += r5 >> 30; r5 &= M30;
    r7 += r6 >> 30; r6 &= M30;
    r8 += r7 >> 30; r7 &= M30;

    /* In a second step add the modulus again if the result is still negative, bringing r to range
     * [0,modulus). */
    cond_add = r8 >> 31;
    r0 += modinfo->modulus.v[0] & cond_add;
    r1 += modinfo->modulus.v[1] & cond_add;
    r2 += modinfo->modulus.v[2] & cond_add;
    r3 += modinfo->modulus.v[3] & cond_add;
    r4 += modinfo->modulus.v[4] & cond_add;
    r5 += modinfo->modulus.v[5] & cond_add;
    r6 += modinfo->modulus.v[6] & cond_add;
    r7 += modinfo->modulus.v[7] & cond_add;
    r8 += modinfo->modulus.v[8] & cond_add;
    /* And propagate again. */
    r1 += r0 >> 30; r0 &= M30;
    r2 += r1 >> 30; r1 &= M30;
    r3 += r2 >> 30; r2 &= M30;
    r4 += r3 >> 30; r3 &= M30;
    r5 += r4 >> 30; r4 &= M30;
    r6 += r5 >> 30; r5 &= M30;
    r7 += r6 >> 30; r6 &= M30;
    r8 += r7 >> 30; r7 &= M30;

    r->v[0] = r0;
    r->v[1] = r1;
    r->v[2] = r2;
    r->v[3] = r3;
    r->v[4] = r4;
    r->v[5] = r5;
    r->v[6] = r6;
    r->v[7] = r7;
    r->v[8] = r8;

    VERIFY_CHECK(r0 >> 30 == 0);
    VERIFY_CHECK(r1 >> 30 == 0);
    VERIFY_CHECK(r2 >> 30 == 0);
    VERIFY_CHECK(r3 >> 30 == 0);
    VERIFY_CHECK(r4 >> 30 == 0);
    VERIFY_CHECK(r5 >> 30 == 0);
    VERIFY_CHECK(r6 >> 30 == 0);
    VERIFY_CHECK(r7 >> 30 == 0);
    VERIFY_CHECK(r8 >> 30 == 0);
    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(r, 9, &modinfo->modulus, 0) >= 0); /* r >= 0 */
    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(r, 9, &modinfo->modulus, 1) < 0); /* r < modulus */
}